

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O2

void __thiscall wasm::Instrumenter::addSecondaryMemory(Instrumenter *this,size_t numFuncs)

{
  InstrumenterConfig *pIVar1;
  char *pcVar2;
  char *in_RCX;
  string_view sVar3;
  Name root;
  Name name;
  undefined1 local_1a8 [8];
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> mem;
  
  pIVar1 = this->config;
  if (pIVar1->storageKind == InSecondaryMemory) {
    if (((this->wasm->features).features & 0x10000) == 0) {
      Fatal::Fatal((Fatal *)local_1a8);
      Fatal::operator<<((Fatal *)local_1a8,
                        (char (*) [67])
                        "error: --in-secondary-memory requires multi-memories to be enabled");
      Fatal::~Fatal((Fatal *)local_1a8);
    }
    root.super_IString.str._M_str = in_RCX;
    root.super_IString.str._M_len = (size_t)(pIVar1->secondaryMemoryName).super_IString.str._M_str;
    sVar3 = (string_view)
            Names::getValidMemoryName
                      ((Names *)this->wasm,
                       (Module *)(pIVar1->secondaryMemoryName).super_IString.str._M_len,root);
    (this->secondaryMemory).super_IString.str = sVar3;
    name.super_IString.str._M_str = (char *)sVar3._M_len;
    name.super_IString.str._M_len = (size_t)local_1a8;
    Builder::makeMemory(name,(Address)sVar3._M_str,(Address)(numFuncs + 0xffff >> 0x10),
                        SUB81(numFuncs + 0xffff >> 0x10,0),(Type)0x1);
    pcVar2 = (this->config->importNamespace).super_IString.str._M_str;
    *(size_t *)((long)local_1a8 + 0x18) = (this->config->importNamespace).super_IString.str._M_len;
    *(char **)((long)local_1a8 + 0x20) = pcVar2;
    pcVar2 = (this->config->secondaryMemoryName).super_IString.str._M_str;
    *(size_t *)((long)local_1a8 + 0x28) =
         (this->config->secondaryMemoryName).super_IString.str._M_len;
    *(char **)((long)local_1a8 + 0x30) = pcVar2;
    wasm::Module::addMemory((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
              ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)local_1a8);
  }
  return;
}

Assistant:

void Instrumenter::addSecondaryMemory(size_t numFuncs) {
  if (config.storageKind != WasmSplitOptions::StorageKind::InSecondaryMemory) {
    // Don't need secondary memory
    return;
  }
  if (!wasm->features.hasMultiMemories()) {
    Fatal()
      << "error: --in-secondary-memory requires multi-memories to be enabled";
  }

  secondaryMemory =
    Names::getValidMemoryName(*wasm, config.secondaryMemoryName);
  // Create a memory with enough pages to write into
  size_t pages = (numFuncs + Memory::kPageSize - 1) / Memory::kPageSize;
  auto mem = Builder::makeMemory(secondaryMemory, pages, pages, true);
  mem->module = config.importNamespace;
  mem->base = config.secondaryMemoryName;
  wasm->addMemory(std::move(mem));
}